

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O1

int WildMidi_SetOption(midi *handle,unsigned_short options,unsigned_short setting)

{
  char *pcVar1;
  int wmerno;
  uint uVar2;
  
  if (WM_Initialized == '\0') {
    uVar2 = 0xa81;
    wmerno = 8;
    pcVar1 = (char *)0x0;
  }
  else {
    if (handle != (midi *)0x0) {
      FCriticalSection::Enter((FCriticalSection *)handle);
      if (options < 8 && (options & 7) != 0) {
        if (setting < 8) {
          *(unsigned_short *)((long)handle + 0x30) =
               setting & options | (options ^ 0xff) & *(ushort *)((long)handle + 0x30);
          if ((options & 1) == 0) {
            if (3 < options) {
              _WM_reset_reverb(*(_rvb **)((long)handle + 0x50378));
            }
          }
          else {
            _WM_AdjustChannelVolumes((_mdi *)handle,'\x10');
          }
          FCriticalSection::Leave((FCriticalSection *)handle);
          return 0;
        }
        pcVar1 = "(invalid setting)";
        uVar2 = 0xa93;
      }
      else {
        pcVar1 = "(invalid option)";
        uVar2 = 0xa8d;
      }
      _WM_ERROR("WildMidi_SetOption",uVar2,9,pcVar1,0);
      FCriticalSection::Leave((FCriticalSection *)handle);
      return -1;
    }
    pcVar1 = "(NULL handle)";
    uVar2 = 0xa85;
    wmerno = 9;
  }
  _WM_ERROR("WildMidi_SetOption",uVar2,wmerno,pcVar1,0);
  return -1;
}

Assistant:

WM_SYMBOL int WildMidi_SetOption(midi * handle, unsigned short int options,
		unsigned short int setting) {
	struct _mdi *mdi;

	if (!WM_Initialized) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_NOT_INIT, NULL, 0);
		return -1;
	}
	if (handle == NULL) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG, "(NULL handle)",
				0);
		return -1;
	}

	mdi = (struct _mdi *) handle;
	mdi->lock.Enter();
	if ((!(options & 0x0007)) || (options & 0xFFF8)) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG, "(invalid option)",
				0);
		mdi->lock.Leave();
		return -1;
	}
	if (setting & 0xFFF8) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG,
				"(invalid setting)", 0);
		mdi->lock.Leave();
		return -1;
	}

	mdi->info.mixer_options = ((mdi->info.mixer_options & (0x00FF ^ options))
			| (options & setting));

	if (options & WM_MO_LOG_VOLUME) {
		_WM_AdjustChannelVolumes(mdi, 16);	// Settings greater than 15
											// adjust all channels
	} else if (options & WM_MO_REVERB) {
		_WM_reset_reverb(mdi->reverb);
	}

	mdi->lock.Leave();
	return 0;
}